

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int SetRudderThrustersFluxSSC32
              (SSC32 *pSSC32,double angle,double urt,double ult,double urf,double ulf)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int pws [32];
  int selectedchannels [32];
  
  selectedchannels[0] = 0;
  selectedchannels[1] = 0;
  selectedchannels[2] = 0;
  selectedchannels[3] = 0;
  selectedchannels[4] = 0;
  selectedchannels[5] = 0;
  selectedchannels[6] = 0;
  selectedchannels[7] = 0;
  selectedchannels[8] = 0;
  selectedchannels[9] = 0;
  selectedchannels[10] = 0;
  selectedchannels[0xb] = 0;
  selectedchannels[0xc] = 0;
  selectedchannels[0xd] = 0;
  selectedchannels[0xe] = 0;
  selectedchannels[0xf] = 0;
  selectedchannels[0x10] = 0;
  selectedchannels[0x11] = 0;
  selectedchannels[0x12] = 0;
  selectedchannels[0x13] = 0;
  selectedchannels[0x14] = 0;
  selectedchannels[0x15] = 0;
  selectedchannels[0x16] = 0;
  selectedchannels[0x17] = 0;
  selectedchannels[0x18] = 0;
  selectedchannels[0x19] = 0;
  selectedchannels[0x1a] = 0;
  selectedchannels[0x1b] = 0;
  selectedchannels[0x1c] = 0;
  selectedchannels[0x1d] = 0;
  selectedchannels[0x1e] = 0;
  selectedchannels[0x1f] = 0;
  pws[0] = 0;
  pws[1] = 0;
  pws[2] = 0;
  pws[3] = 0;
  pws[4] = 0;
  pws[5] = 0;
  pws[6] = 0;
  pws[7] = 0;
  pws[8] = 0;
  pws[9] = 0;
  pws[10] = 0;
  pws[0xb] = 0;
  pws[0xc] = 0;
  pws[0xd] = 0;
  pws[0xe] = 0;
  pws[0xf] = 0;
  pws[0x10] = 0;
  pws[0x11] = 0;
  pws[0x12] = 0;
  pws[0x13] = 0;
  pws[0x14] = 0;
  pws[0x15] = 0;
  pws[0x16] = 0;
  pws[0x17] = 0;
  pws[0x18] = 0;
  pws[0x19] = 0;
  pws[0x1a] = 0;
  pws[0x1b] = 0;
  pws[0x1c] = 0;
  pws[0x1d] = 0;
  pws[0x1e] = 0;
  pws[0x1f] = 0;
  dVar1 = pSSC32->MidAngle;
  if (0.0 <= angle) {
    dVar8 = pSSC32->MinAngle;
    dVar10 = pSSC32->MaxAngle;
    dVar11 = dVar10 - dVar1;
  }
  else {
    dVar8 = pSSC32->MinAngle;
    dVar10 = pSSC32->MaxAngle;
    dVar11 = dVar1 - dVar8;
  }
  dVar10 = ABS(dVar10);
  dVar12 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar12 = dVar10;
  }
  dVar9 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar9 = dVar10;
  }
  iVar6 = pSSC32->rudderchan;
  pws[iVar6] = (int)(((dVar1 + (dVar11 * angle) / dVar12) * 500.0) / dVar9) + 0x5dc;
  iVar2 = pSSC32->rightthrusterchan;
  pws[iVar2] = (int)(urt * 1000.0 * 0.5) + 0x5dc;
  iVar3 = pSSC32->leftthrusterchan;
  pws[iVar3] = (int)(ult * 1000.0 * 0.5) + 0x5dc;
  iVar4 = pSSC32->rightfluxchan;
  pws[iVar4] = (int)(urf * 1000.0 * 0.5) + 0x5dc;
  iVar5 = pSSC32->leftfluxchan;
  pws[iVar5] = (int)(ulf * 1000.0 * 0.5) + 0x5dc;
  iVar7 = pws[iVar6];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar6] = iVar7;
  iVar7 = pws[iVar2];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar2] = iVar7;
  iVar7 = pws[iVar3];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar3] = iVar7;
  iVar7 = pws[iVar4];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar4] = iVar7;
  iVar7 = 2000;
  if (pws[iVar5] < 2000) {
    iVar7 = pws[iVar5];
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar5] = iVar7;
  selectedchannels[iVar6] = 1;
  selectedchannels[iVar2] = 1;
  selectedchannels[iVar3] = 1;
  selectedchannels[iVar4] = 1;
  selectedchannels[iVar5] = 1;
  iVar6 = SetAllPWMsSSC32(pSSC32,selectedchannels,pws);
  return iVar6;
}

Assistant:

inline int SetRudderThrustersFluxSSC32(SSC32* pSSC32, double angle, double urt, double ult, double urf, double ulf)
{
	int selectedchannels[NB_CHANNELS_PWM_SSC32];
	int pws[NB_CHANNELS_PWM_SSC32];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into SSC32 pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pSSC32->MidAngle+angle*(pSSC32->MaxAngle-pSSC32->MidAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)): pSSC32->MidAngle+angle*(pSSC32->MidAngle-pSSC32->MinAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle));
	//angletmp = angle >= 0? pSSC32->MidAngle+urudder*(pSSC32->MaxAngle-pSSC32->MidAngle): pSSC32->MidAngle+urudder*(pSSC32->MidAngle-pSSC32->MinAngle);
	if (angletmp >= 0)
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
	else
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MID_PW_SSC32-DEFAULT_MIN_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
#else
	pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angle*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)
		/(pSSC32->MaxAngle-pSSC32->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into SSC32 pulse width (in us).
	pws[pSSC32->rightthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(urt*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(ult*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->rightfluxchan] = DEFAULT_MID_PW_SSC32+(int)(urf*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftfluxchan] = DEFAULT_MID_PW_SSC32+(int)(ulf*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);

	pws[pSSC32->rudderchan] = max(min(pws[pSSC32->rudderchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightthrusterchan] = max(min(pws[pSSC32->rightthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftthrusterchan] = max(min(pws[pSSC32->leftthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightfluxchan] = max(min(pws[pSSC32->rightfluxchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftfluxchan] = max(min(pws[pSSC32->leftfluxchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	selectedchannels[pSSC32->rudderchan] = 1;
	selectedchannels[pSSC32->rightthrusterchan] = 1;
	selectedchannels[pSSC32->leftthrusterchan] = 1;
	selectedchannels[pSSC32->rightfluxchan] = 1;
	selectedchannels[pSSC32->leftfluxchan] = 1;

	return SetAllPWMsSSC32(pSSC32, selectedchannels, pws);
}